

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.cpp
# Opt level: O3

void de::StringUtil_selfTest(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  int iVar4;
  deBool dVar5;
  ulong uVar6;
  locale *plVar7;
  ctype *pcVar8;
  int precision;
  size_type offset;
  ulong uVar9;
  bool bVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  ostringstream s;
  string local_1b8;
  string local_198 [3];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,0x2a);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  iVar4 = std::__cxx11::string::compare((char *)&local_1b8);
  paVar1 = &local_1b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    deAssertFail("toString(42) == \"42\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"foo",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  iVar4 = std::__cxx11::string::compare((char *)&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    deAssertFail("toString(\"foo\") == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa2);
  }
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"FooBar","");
  toLower(local_198,&local_1b8);
  iVar4 = std::__cxx11::string::compare((char *)local_198);
  paVar2 = &local_198[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    deAssertFail("toLower(\"FooBar\") == \"foobar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa3);
  }
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"FooBar","");
  toUpper(local_198,&local_1b8);
  iVar4 = std::__cxx11::string::compare((char *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    deAssertFail("toUpper(\"FooBar\") == \"FOOBAR\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa4);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198," foo bar\n\tbaz   ","");
  splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8,local_198,'\0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (local_1b8._M_string_length - (long)local_1b8._M_dataplus._M_p != 0x60) {
    deAssertFail("tokens.size() == 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa8);
  }
  iVar4 = std::__cxx11::string::compare(local_1b8._M_dataplus._M_p);
  if (iVar4 != 0) {
    deAssertFail("tokens[0] == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa9);
  }
  iVar4 = std::__cxx11::string::compare(local_1b8._M_dataplus._M_p + 0x20);
  if (iVar4 != 0) {
    deAssertFail("tokens[1] == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xaa);
  }
  iVar4 = std::__cxx11::string::compare(local_1b8._M_dataplus._M_p + 0x40);
  if (iVar4 != 0) {
    deAssertFail("tokens[2] == \"baz\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xab);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8);
  floatToString_abi_cxx11_(local_198,(de *)&DAT_00000001,4.0,precision);
  iVar4 = std::__cxx11::string::compare((char *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    deAssertFail("floatToString(4, 1) == \"4.0\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xae);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foobar","");
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 != 1) {
    deAssertFail("beginsWith(\"foobar\", \"foobar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb0);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foo","");
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 != 1) {
    deAssertFail("beginsWith(\"foobar\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb1);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"f","");
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 != 1) {
    deAssertFail("beginsWith(\"foobar\", \"f\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb2);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,0x1aee929);
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 != 1) {
    deAssertFail("beginsWith(\"foobar\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb3);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,0x1aee929);
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,0x1aee929);
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 != 1) {
    deAssertFail("beginsWith(\"\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb4);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"bar","");
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 == 1) {
    deAssertFail("!beginsWith(\"foobar\", \"bar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb5);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foobarbaz","");
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 == 1) {
    deAssertFail("!beginsWith(\"foobar\", \"foobarbaz\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb6);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,0x1aee929);
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foo","");
  dVar5 = deStringBeginsWith(local_198[0]._M_dataplus._M_p,local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (dVar5 == 1) {
    deAssertFail("!beginsWith(\"\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb7);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foobar","");
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    deAssertFail("endsWith(\"foobar\", \"foobar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb9);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"bar","");
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    deAssertFail("endsWith(\"foobar\", \"bar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xba);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"r","");
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    deAssertFail("endsWith(\"foobar\", \"r\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbb);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,0x1aee929);
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    deAssertFail("endsWith(\"foobar\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbc);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,0x1aee929);
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,0x1aee929);
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    deAssertFail("endsWith(\"\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbd);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foo","");
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    deAssertFail("!endsWith(\"foobar\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbe);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"bazfoobar","");
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    deAssertFail("!endsWith(\"foobar\", \"bazfoobar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbf);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"foobar","");
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foobarbaz","");
  uVar9 = local_198[0]._M_string_length - local_1b8._M_string_length;
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar6 = std::__cxx11::string::find((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,uVar9);
    bVar10 = uVar6 == uVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    deAssertFail("!endsWith(\"foobar\", \"foobarbaz\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc0);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,0x1aee929);
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"foo","");
  if (local_198[0]._M_string_length < local_1b8._M_string_length) {
    bVar10 = false;
  }
  else {
    uVar9 = std::__cxx11::string::find
                      ((char *)local_198,(ulong)local_1b8._M_dataplus._M_p,
                       local_198[0]._M_string_length - local_1b8._M_string_length);
    bVar10 = uVar9 == local_198[0]._M_string_length - local_1b8._M_string_length;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    deAssertFail("!endsWith(\"\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc1);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  cVar3 = (**(code **)(*(long *)pcVar8 + 0x10))(pcVar8,0x61);
  if (cVar3 != 'A') {
    deAssertFail("toUpper(\'a\') == \'A\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc3);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  cVar3 = (**(code **)(*(long *)pcVar8 + 0x10))(pcVar8,0x41);
  if (cVar3 != 'A') {
    deAssertFail("toUpper(\'A\') == \'A\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc4);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  cVar3 = (**(code **)(*(long *)pcVar8 + 0x20))(pcVar8,0x61);
  if (cVar3 != 'a') {
    deAssertFail("toLower(\'a\') == \'a\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc5);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  cVar3 = (**(code **)(*(long *)pcVar8 + 0x20))(pcVar8,0x41);
  if (cVar3 != 'a') {
    deAssertFail("toLower(\'A\') == \'a\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc6);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 0x83) & 1) == 0) {
    deAssertFail("isUpper(\'A\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,199);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 0xc3) & 1) != 0) {
    deAssertFail("!isUpper(\'a\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,200);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 0xc3) & 2) == 0) {
    deAssertFail("isLower(\'a\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc9);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 0x83) & 2) != 0) {
    deAssertFail("!isLower(\'A\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xca);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 0x61) & 8) == 0) {
    deAssertFail("isDigit(\'0\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xcb);
  }
  plVar7 = (locale *)std::locale::classic();
  pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
  if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 0xc3) & 8) != 0) {
    deAssertFail("!isDigit(\'a\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xcc);
  }
  return;
}

Assistant:

void StringUtil_selfTest (void)
{

	DE_TEST_ASSERT(toString(42) == "42");
	DE_TEST_ASSERT(toString("foo") == "foo");
	DE_TEST_ASSERT(toLower("FooBar") == "foobar");
	DE_TEST_ASSERT(toUpper("FooBar") == "FOOBAR");

	{
		vector <string> tokens(splitString(" foo bar\n\tbaz   "));
		DE_TEST_ASSERT(tokens.size() == 3);
		DE_TEST_ASSERT(tokens[0] == "foo");
		DE_TEST_ASSERT(tokens[1] == "bar");
		DE_TEST_ASSERT(tokens[2] == "baz");
	}

	DE_TEST_ASSERT(floatToString(4, 1) == "4.0");

	DE_TEST_ASSERT(beginsWith("foobar", "foobar"));
	DE_TEST_ASSERT(beginsWith("foobar", "foo"));
	DE_TEST_ASSERT(beginsWith("foobar", "f"));
	DE_TEST_ASSERT(beginsWith("foobar", ""));
	DE_TEST_ASSERT(beginsWith("", ""));
	DE_TEST_ASSERT(!beginsWith("foobar", "bar"));
	DE_TEST_ASSERT(!beginsWith("foobar", "foobarbaz"));
	DE_TEST_ASSERT(!beginsWith("", "foo"));

	DE_TEST_ASSERT(endsWith("foobar", "foobar"));
	DE_TEST_ASSERT(endsWith("foobar", "bar"));
	DE_TEST_ASSERT(endsWith("foobar", "r"));
	DE_TEST_ASSERT(endsWith("foobar", ""));
	DE_TEST_ASSERT(endsWith("", ""));
	DE_TEST_ASSERT(!endsWith("foobar", "foo"));
	DE_TEST_ASSERT(!endsWith("foobar", "bazfoobar"));
	DE_TEST_ASSERT(!endsWith("foobar", "foobarbaz"));
	DE_TEST_ASSERT(!endsWith("", "foo"));

	DE_TEST_ASSERT(toUpper('a') == 'A');
	DE_TEST_ASSERT(toUpper('A') == 'A');
	DE_TEST_ASSERT(toLower('a') == 'a');
	DE_TEST_ASSERT(toLower('A') == 'a');
	DE_TEST_ASSERT(isUpper('A'));
	DE_TEST_ASSERT(!isUpper('a'));
	DE_TEST_ASSERT(isLower('a'));
	DE_TEST_ASSERT(!isLower('A'));
	DE_TEST_ASSERT(isDigit('0'));
	DE_TEST_ASSERT(!isDigit('a'));
}